

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall REPL::loop(REPL *this)

{
  pointer pvVar1;
  bool bVar2;
  istream *piVar3;
  ostream *poVar4;
  Position *other;
  int z;
  int y;
  int x;
  AI *local_1f8;
  string buffer;
  string command;
  istringstream ss;
  
  local_1f8 = &this->ai;
  do {
    buffer._M_dataplus._M_p = (pointer)&buffer.field_2;
    buffer._M_string_length = 0;
    buffer.field_2._M_local_buf[0] = '\0';
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)&buffer);
    std::__cxx11::istringstream::istringstream((istringstream *)&ss,(string *)&buffer,_S_in);
    command._M_dataplus._M_p = (pointer)&command.field_2;
    command._M_string_length = 0;
    command.field_2._M_local_buf[0] = '\0';
    std::operator>>((istream *)&ss,(string *)&command);
    bVar2 = std::operator==(&command,"START");
    if (!bVar2) {
      bVar2 = std::operator==(&command,"PLACE");
      if (bVar2) {
        piVar3 = (istream *)std::istream::operator>>((istream *)&ss,&x);
        piVar3 = (istream *)std::istream::operator>>(piVar3,&y);
        std::istream::operator>>(piVar3,&z);
        *(int *)(*(long *)&(this->board).
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[x].
                           super__Vector_base<int,_std::allocator<int>_>._M_impl + (long)y * 4) = z;
      }
      else {
        bVar2 = std::operator==(&command,"DONE");
        if (bVar2) {
          poVar4 = std::operator<<((ostream *)&std::cout,"OK");
          std::endl<char,std::char_traits<char>>(poVar4);
        }
        else {
          bVar2 = std::operator==(&command,"BEGIN");
          if (bVar2) {
            _x = AI::begin(local_1f8);
            *(undefined4 *)
             (*(long *)&(this->board).
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[x].
                        super__Vector_base<int,_std::allocator<int>_>._M_impl +
             ((long)_x >> 0x20) * 4) = 1;
            poVar4 = operator<<((ostream *)&std::cout,(Position *)&x);
            std::endl<char,std::char_traits<char>>(poVar4);
          }
          else {
            bVar2 = std::operator==(&command,"TURN");
            if (bVar2) {
              piVar3 = (istream *)std::istream::operator>>((istream *)&ss,&y);
              other = (Position *)&z;
              std::istream::operator>>(piVar3,&z);
              pvVar1 = (this->board).
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              *(undefined4 *)
               (*(long *)&pvVar1[y].super__Vector_base<int,_std::allocator<int>_>._M_impl +
               (long)z * 4) = 2;
              _x = AI::turn(local_1f8,other);
              *(undefined4 *)
               (*(long *)&pvVar1[x].super__Vector_base<int,_std::allocator<int>_>._M_impl +
               ((long)_x >> 0x20) * 4) = 1;
              poVar4 = operator<<((ostream *)&std::cout,(Position *)&x);
              std::endl<char,std::char_traits<char>>(poVar4);
            }
            else {
              bVar2 = std::operator==(&command,"END");
              if (bVar2) {
                std::__cxx11::string::~string((string *)&command);
                std::__cxx11::istringstream::~istringstream((istringstream *)&ss);
                std::__cxx11::string::~string((string *)&buffer);
                return;
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&command);
    std::__cxx11::istringstream::~istringstream((istringstream *)&ss);
    std::__cxx11::string::~string((string *)&buffer);
  } while( true );
}

Assistant:

void REPL::loop() {
    while (true) {
        string buffer;
        getline(cin, buffer);
        istringstream ss(buffer);

        string command;
        ss >> command;
        if (command == START) {
            ai.init();
        } else if (command == PLACE) {
            int x, y, z;
            ss >> x >> y >> z;
            board[x][y] = z;
        } else if (command == DONE) {
            cout << "OK" << endl;
        } else if (command == BEGIN) {
            Position pos = ai.begin();
            board[pos.x][pos.y] = ME;
            cout << pos << endl;
        } else if (command == TURN) {
            int x, y;
            ss >> x >> y;
            board[x][y] = OTHER;
            Position pos = ai.turn({x, y});
            board[pos.x][pos.y] = ME;
            cout << pos << endl;
        } else if (command == END) {
            break;
        }
    }
}